

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O0

void __thiscall TC_parser<true>::maybeFeature(TC_parser<true> *this)

{
  float fVar1;
  features *this_00;
  example *peVar2;
  ulong uVar3;
  substring s;
  substring sVar4;
  uint64_t uVar5;
  size_t sVar6;
  char **ppcVar7;
  size_type sVar8;
  size_type sVar9;
  features **ppfVar10;
  float **ppfVar11;
  unsigned_long **ppuVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  unsigned_long *puVar14;
  ostream *poVar15;
  TC_parser<true> *in_RDI;
  float fVar16;
  char *fc;
  stringstream ss;
  uint64_t id;
  size_t i;
  features *dict_fs;
  features *feats;
  uint64_t hash;
  feature_dict *map;
  size_t dict;
  v_array<char> spelling_v;
  uint64_t word_hash_1;
  substring spelling_ss;
  char d;
  char *c;
  features *spell_fs;
  v_array<char> affix_v;
  substring affix_name;
  uint64_t len;
  bool is_prefix;
  uint64_t affix;
  features *affix_fs;
  v_array<char> feature_v;
  features *fs;
  uint64_t word_hash;
  substring feature_name;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffba8;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffbb0;
  TC_parser<true> *in_stack_fffffffffffffbb8;
  features *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__y;
  features *__x;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbe0;
  v_array<unsigned_long> *in_stack_fffffffffffffbe8;
  char **in_stack_fffffffffffffbf0;
  char (*in_stack_fffffffffffffbf8) [9];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc00;
  string local_368 [48];
  char *local_338;
  stringstream local_330 [16];
  stringstream local_320 [168];
  uint64_t in_stack_fffffffffffffd88;
  substring *in_stack_fffffffffffffd90;
  v_hashmap<substring,_features_*> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  size_type local_178;
  v_array<char> local_158;
  char *local_138;
  char *local_130;
  uint64_t local_128;
  char *local_120;
  char *local_118;
  undefined1 local_109;
  char *local_108;
  features *local_100;
  undefined1 local_e5;
  undefined1 local_e4;
  char local_e3;
  char local_e2;
  uchar local_e1;
  v_array<char> local_e0;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  ulong local_a0;
  byte local_91;
  ulong local_90;
  features *local_88;
  undefined1 local_59;
  v_array<char> local_58;
  features *local_38;
  char *local_30;
  char *local_28;
  ulong local_20;
  substring local_18;
  
  if ((((*in_RDI->reading_head != ' ') && (*in_RDI->reading_head != '\t')) &&
      (*in_RDI->reading_head != '|')) &&
     ((in_RDI->reading_head != in_RDI->endLine && (*in_RDI->reading_head != '\r')))) {
    local_18 = read_name(in_RDI);
    fVar1 = in_RDI->cur_channel_v;
    fVar16 = featureValue(in_stack_fffffffffffffbb8);
    in_RDI->v = fVar1 * fVar16;
    if (local_18.end == local_18.begin) {
      sVar6 = in_RDI->anon;
      in_RDI->anon = sVar6 + 1;
      local_20 = in_RDI->channel_hash + sVar6;
    }
    else {
      local_30 = local_18.begin;
      local_28 = local_18.end;
      uVar5 = (*in_RDI->p->hasher)(local_18,in_RDI->channel_hash);
      local_20 = uVar5 & in_RDI->parse_mask;
    }
    if ((in_RDI->v != 0.0) || (NAN(in_RDI->v))) {
      local_38 = (in_RDI->ae->super_example_predict).feature_space + in_RDI->index;
      features::push_back(in_stack_fffffffffffffbc0,
                          (feature_value)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                          (feature_index)in_stack_fffffffffffffbb0);
      v_init<char>();
      push_many<char>((v_array<char> *)in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8,
                      (size_t)in_stack_fffffffffffffbb0);
      local_59 = 0;
      v_array<char>::push_back
                ((v_array<char> *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
      operator_new(0x40);
      v_array<char>::begin(&local_58);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char_*&,_char_*&,_true>
                (in_stack_fffffffffffffc00,(char **)in_stack_fffffffffffffbf8,
                 in_stack_fffffffffffffbf0);
      std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
      shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(in_stack_fffffffffffffbb0,
                  (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffba8);
      std::
      shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x17860a);
      v_array<char>::delete_v((v_array<char> *)in_stack_fffffffffffffbb0);
      if (in_RDI->affix_features[in_RDI->index] != 0) {
        if (local_18.end != local_18.begin) {
          local_88 = (in_RDI->ae->super_example_predict).feature_space + 0x84;
          sVar6 = features::size((features *)0x178673);
          if (sVar6 == 0) {
            v_array<unsigned_char>::push_back
                      ((v_array<unsigned_char> *)in_stack_fffffffffffffbb0,
                       (uchar *)in_stack_fffffffffffffba8);
          }
          for (local_90 = in_RDI->affix_features[in_RDI->index]; local_90 != 0;
              local_90 = local_90 >> 4) {
            local_91 = (local_90 & 1) != 0;
            local_a0 = local_90 >> 1 & 7;
            local_b0 = local_18.begin;
            local_a8 = local_18.end;
            if (local_18.begin + local_a0 < local_18.end) {
              if ((bool)local_91) {
                local_a8 = local_18.begin + local_a0;
              }
              else {
                local_b0 = local_18.end + -local_a0;
              }
            }
            local_c0 = local_b0;
            local_b8 = local_a8;
            sVar4.end = local_a8;
            sVar4.begin = local_b0;
            uVar5 = (*in_RDI->p->hasher)(sVar4,in_RDI->channel_hash);
            local_20 = uVar5 * ((local_90 & 0xf) * 0x1aa5cfd + 0xd42855);
            features::push_back(in_stack_fffffffffffffbc0,
                                (feature_value)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                                (feature_index)in_stack_fffffffffffffbb0);
            v_init<char>();
            if (in_RDI->index != ' ') {
              local_e1 = in_RDI->index;
              v_array<char>::push_back
                        ((v_array<char> *)in_stack_fffffffffffffbb0,
                         (char *)in_stack_fffffffffffffba8);
            }
            local_e2 = (~local_91 & 1) * '\x02' + '+';
            v_array<char>::push_back
                      ((v_array<char> *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8)
            ;
            local_e3 = (char)local_a0 + '0';
            v_array<char>::push_back
                      ((v_array<char> *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8)
            ;
            local_e4 = 0x3d;
            v_array<char>::push_back
                      ((v_array<char> *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8)
            ;
            push_many<char>((v_array<char> *)in_stack_fffffffffffffbc0,
                            (char *)in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0);
            local_e5 = 0;
            v_array<char>::push_back
                      ((v_array<char> *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8)
            ;
            operator_new(0x40);
            v_array<char>::begin(&local_e0);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<const_char_(&)[6],_char_*&,_true>
                      (in_stack_fffffffffffffc00,(char (*) [6])in_stack_fffffffffffffbf8,
                       in_stack_fffffffffffffbf0);
            std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
            shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                      ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
            v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back(in_stack_fffffffffffffbb0,
                        (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffba8);
            std::
            shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x1789e4);
          }
        }
      }
      if ((in_RDI->spelling_features[in_RDI->index] & 1U) != 0) {
        local_100 = (in_RDI->ae->super_example_predict).feature_space + 0x85;
        sVar6 = features::size((features *)0x178a90);
        if (sVar6 == 0) {
          v_array<unsigned_char>::push_back
                    ((v_array<unsigned_char> *)in_stack_fffffffffffffbb0,
                     (uchar *)in_stack_fffffffffffffba8);
        }
        v_array<char>::clear((v_array<char> *)in_stack_fffffffffffffbb0);
        for (local_108 = local_18.begin; local_108 != local_18.end; local_108 = local_108 + 1) {
          if ((*local_108 < '0') || ('9' < *local_108)) {
            if ((*local_108 < 'a') || ('z' < *local_108)) {
              if ((*local_108 < 'A') || ('Z' < *local_108)) {
                if (*local_108 == '.') {
                  local_109 = 0x2e;
                }
                else {
                  local_109 = 0x23;
                }
              }
              else {
                local_109 = 0x41;
              }
            }
            else {
              local_109 = 0x61;
            }
          }
          else {
            local_109 = 0x30;
          }
          v_array<char>::push_back
                    ((v_array<char> *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
        }
        ppcVar7 = v_array<char>::begin(&in_RDI->spelling);
        local_120 = *ppcVar7;
        ppcVar7 = v_array<char>::end(&in_RDI->spelling);
        local_130 = *ppcVar7;
        local_138 = local_120;
        s.end = in_stack_fffffffffffffbc8;
        s.begin = (char *)in_stack_fffffffffffffbc0;
        local_118 = local_130;
        local_128 = hashstring(s,(uint64_t)in_stack_fffffffffffffbb8);
        features::push_back(in_stack_fffffffffffffbc0,
                            (feature_value)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                            (feature_index)in_stack_fffffffffffffbb0);
        v_init<char>();
        if (in_RDI->index != ' ') {
          v_array<char>::push_back
                    ((v_array<char> *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
          v_array<char>::push_back
                    ((v_array<char> *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
        }
        push_many<char>((v_array<char> *)in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8
                        ,(size_t)in_stack_fffffffffffffbb0);
        v_array<char>::push_back
                  ((v_array<char> *)in_stack_fffffffffffffbb0,(char *)in_stack_fffffffffffffba8);
        operator_new(0x40);
        v_array<char>::begin(&local_158);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[9],_char_*&,_true>
                  (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
        std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
        shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                  ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(in_stack_fffffffffffffbb0,
                    (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffba8);
        std::
        shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x178d8d);
      }
      sVar8 = std::
              vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
              ::size(in_RDI->namespace_dictionaries + in_RDI->index);
      if (sVar8 != 0) {
        local_178 = 0;
        while (sVar8 = local_178,
              sVar9 = std::
                      vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
                      ::size(in_RDI->namespace_dictionaries + in_RDI->index), sVar8 < sVar9) {
          std::
          vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
          ::operator[](in_RDI->namespace_dictionaries + in_RDI->index,local_178);
          uniform_hash(in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,
                       (uint64_t)in_stack_fffffffffffffbe0);
          ppfVar10 = v_hashmap<substring,_features_*>::get
                               (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                                in_stack_fffffffffffffd88);
          this_00 = *ppfVar10;
          if ((this_00 != (features *)0x0) &&
             (sVar6 = v_array<float>::size(&this_00->values), sVar6 != 0)) {
            peVar2 = in_RDI->ae;
            __x = (peVar2->super_example_predict).feature_space + 0x87;
            sVar6 = features::size((features *)0x178f22);
            if (sVar6 == 0) {
              v_array<unsigned_char>::push_back
                        ((v_array<unsigned_char> *)in_stack_fffffffffffffbb0,
                         (uchar *)in_stack_fffffffffffffba8);
            }
            ppfVar11 = v_array<float>::begin(&this_00->values);
            in_stack_fffffffffffffbe0 =
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)*ppfVar11;
            v_array<float>::size(&this_00->values);
            push_many<float>(&in_stack_fffffffffffffbc0->values,(float *)in_stack_fffffffffffffbb8,
                             (size_t)in_stack_fffffffffffffbb0);
            in_stack_fffffffffffffbe8 =
                 &(peVar2->super_example_predict).feature_space[0x87].indicies;
            ppuVar12 = v_array<unsigned_long>::begin(&this_00->indicies);
            in_stack_fffffffffffffbf0 = (char **)*ppuVar12;
            v_array<unsigned_long>::size(&this_00->indicies);
            push_many<unsigned_long>
                      ((v_array<unsigned_long> *)in_stack_fffffffffffffbc0,
                       (unsigned_long *)in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0)
            ;
            (peVar2->super_example_predict).feature_space[0x87].sum_feat_sq =
                 this_00->sum_feat_sq +
                 (peVar2->super_example_predict).feature_space[0x87].sum_feat_sq;
            local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            while (__y = local_1a0,
                  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            v_array<unsigned_long>::size(&this_00->indicies), __y < pbVar13) {
              puVar14 = v_array<unsigned_long>::operator[](&this_00->indicies,(size_t)local_1a0);
              uVar3 = *puVar14;
              std::__cxx11::stringstream::stringstream(local_330);
              poVar15 = std::operator<<((ostream *)(local_330 + 0x10),in_RDI->index);
              std::operator<<(poVar15,'_');
              for (local_338 = local_18.begin; local_338 != local_18.end; local_338 = local_338 + 1)
              {
                std::operator<<((ostream *)(local_330 + 0x10),*local_338);
              }
              in_stack_fffffffffffffbc0 =
                   (features *)std::operator<<((ostream *)(local_330 + 0x10),'=');
              std::ostream::operator<<(in_stack_fffffffffffffbc0,uVar3);
              in_stack_fffffffffffffbb0 =
                   &(peVar2->super_example_predict).feature_space[0x87].space_names;
              in_stack_fffffffffffffbb8 = (TC_parser<true> *)operator_new(0x40);
              std::__cxx11::stringstream::str();
              std::
              pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        (in_stack_fffffffffffffbe0,(char (*) [11])__x,__y);
              std::shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>>::
              shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                        ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
              v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push_back(in_stack_fffffffffffffbb0,
                          (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffba8);
              std::
              shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~shared_ptr((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x1791bd);
              std::__cxx11::string::~string(local_368);
              std::__cxx11::stringstream::~stringstream(local_330);
              local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_1a0->field_0x1;
            }
          }
          local_178 = local_178 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

inline void maybeFeature()
  {
    if (*reading_head == ' ' || *reading_head == '\t' || *reading_head == '|' || reading_head == endLine ||
        *reading_head == '\r')
    {
      // maybeFeature --> ø
    }
    else
    {
      // maybeFeature --> 'String' FeatureValue
      substring feature_name = read_name();
      v = cur_channel_v * featureValue();
      uint64_t word_hash;
      if (feature_name.end != feature_name.begin)
        word_hash = (p->hasher(feature_name, channel_hash) & parse_mask);
      else
        word_hash = channel_hash + anon++;
      if (v == 0)
        return;  // dont add 0 valued features to list of features
      features& fs = ae->feature_space[index];
      fs.push_back(v, word_hash);
      if (audit)
      {
        v_array<char> feature_v = v_init<char>();
        push_many(feature_v, feature_name.begin, feature_name.end - feature_name.begin);
        feature_v.push_back('\0');
        fs.space_names.push_back(audit_strings_ptr(new audit_strings(base, feature_v.begin())));
        feature_v.delete_v();
      }
      if ((affix_features[index] > 0) && (feature_name.end != feature_name.begin))
      {
        features& affix_fs = ae->feature_space[affix_namespace];
        if (affix_fs.size() == 0)
          ae->indices.push_back(affix_namespace);
        uint64_t affix = affix_features[index];
        while (affix > 0)
        {
          bool is_prefix = affix & 0x1;
          uint64_t len = (affix >> 1) & 0x7;
          substring affix_name = {feature_name.begin, feature_name.end};
          if (affix_name.end > affix_name.begin + len)
          {
            if (is_prefix)
              affix_name.end = affix_name.begin + len;
            else
              affix_name.begin = affix_name.end - len;
          }
          word_hash =
              p->hasher(affix_name, (uint64_t)channel_hash) * (affix_constant + (affix & 0xF) * quadratic_constant);
          affix_fs.push_back(v, word_hash);
          if (audit)
          {
            v_array<char> affix_v = v_init<char>();
            if (index != ' ')
              affix_v.push_back(index);
            affix_v.push_back(is_prefix ? '+' : '-');
            affix_v.push_back('0' + (char)len);
            affix_v.push_back('=');
            push_many(affix_v, affix_name.begin, affix_name.end - affix_name.begin);
            affix_v.push_back('\0');
            affix_fs.space_names.push_back(audit_strings_ptr(new audit_strings("affix", affix_v.begin())));
          }
          affix >>= 4;
        }
      }
      if (spelling_features[index])
      {
        features& spell_fs = ae->feature_space[spelling_namespace];
        if (spell_fs.size() == 0)
          ae->indices.push_back(spelling_namespace);
        // v_array<char> spelling;
        spelling.clear();
        for (char* c = feature_name.begin; c != feature_name.end; ++c)
        {
          char d = 0;
          if ((*c >= '0') && (*c <= '9'))
            d = '0';
          else if ((*c >= 'a') && (*c <= 'z'))
            d = 'a';
          else if ((*c >= 'A') && (*c <= 'Z'))
            d = 'A';
          else if (*c == '.')
            d = '.';
          else
            d = '#';
          // if ((spelling.size() == 0) || (spelling.last() != d))
          spelling.push_back(d);
        }
        substring spelling_ss = {spelling.begin(), spelling.end()};
        uint64_t word_hash = hashstring(spelling_ss, (uint64_t)channel_hash);
        spell_fs.push_back(v, word_hash);
        if (audit)
        {
          v_array<char> spelling_v = v_init<char>();
          if (index != ' ')
          {
            spelling_v.push_back(index);
            spelling_v.push_back('_');
          }
          push_many(spelling_v, spelling_ss.begin, spelling_ss.end - spelling_ss.begin);
          spelling_v.push_back('\0');
          spell_fs.space_names.push_back(audit_strings_ptr(new audit_strings("spelling", spelling_v.begin())));
        }
      }
      if (namespace_dictionaries[index].size() > 0)
      {
        for (size_t dict = 0; dict < namespace_dictionaries[index].size(); dict++)
        {
          feature_dict* map = namespace_dictionaries[index][dict];
          uint64_t hash = uniform_hash(feature_name.begin, feature_name.end - feature_name.begin, quadratic_constant);
          features* feats = map->get(feature_name, hash);
          if ((feats != nullptr) && (feats->values.size() > 0))
          {
            features& dict_fs = ae->feature_space[dictionary_namespace];
            if (dict_fs.size() == 0)
              ae->indices.push_back(dictionary_namespace);
            push_many(dict_fs.values, feats->values.begin(), feats->values.size());
            push_many(dict_fs.indicies, feats->indicies.begin(), feats->indicies.size());
            dict_fs.sum_feat_sq += feats->sum_feat_sq;
            if (audit)
              for (size_t i = 0; i < feats->indicies.size(); ++i)
              {
                uint64_t id = feats->indicies[i];
                stringstream ss;
                ss << index << '_';
                for (char* fc = feature_name.begin; fc != feature_name.end; ++fc) ss << *fc;
                ss << '=' << id;
                dict_fs.space_names.push_back(audit_strings_ptr(new audit_strings("dictionary", ss.str())));
              }
          }
        }
      }
    }
  }